

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template.cc
# Opt level: O2

void __thiscall
ctemplate::VariableTemplateNode::WriteHeaderEntries
          (VariableTemplateNode *this,string *outstring,string *filename)

{
  char *pcVar1;
  string local_38;
  
  pcVar1 = (this->token_).text;
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_38,pcVar1,pcVar1 + (this->token_).textlen);
  anon_unknown_14::WriteOneHeaderEntry(outstring,&local_38,filename);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

virtual void WriteHeaderEntries(string *outstring,
                                  const string& filename) const {
    WriteOneHeaderEntry(outstring, string(token_.text, token_.textlen),
                        filename);
  }